

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O2

void mxx::impl::allgatherv_big<int>
               (int *data,size_t size,int *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  MPI_Comm poVar1;
  MPI_Datatype poVar2;
  MPI_Request *ppoVar3;
  void *__stat_loc;
  ulong uVar4;
  long local_c0;
  datatype dt;
  datatype dt_2;
  requests reqs;
  datatype senddt;
  
  reqs._vptr_requests = (_func_int **)&PTR__requests_001aad80;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = 0;
  __stat_loc = (void *)size;
  for (uVar4 = 0; (long)uVar4 < (long)comm->m_size; uVar4 = uVar4 + 1) {
    dt._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
    dt.mpitype = (MPI_Datatype)&ompi_mpi_int;
    dt.builtin = true;
    datatype::contiguous(&senddt,&dt,size);
    datatype::~datatype(&dt);
    poVar2 = senddt.mpitype;
    poVar1 = comm->mpi_comm;
    ppoVar3 = requests::add(&reqs);
    MPI_Isend(data,1,poVar2,uVar4 & 0xffffffff,0x4d2,poVar1,ppoVar3);
    dt_2._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
    dt_2.mpitype = (MPI_Datatype)&ompi_mpi_int;
    dt_2.builtin = true;
    datatype::contiguous
              (&dt,&dt_2,
               (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar4]);
    datatype::~datatype(&dt_2);
    poVar2 = dt.mpitype;
    poVar1 = comm->mpi_comm;
    ppoVar3 = requests::add(&reqs);
    __stat_loc = (void *)0x1;
    MPI_Irecv(out + local_c0,1,poVar2,uVar4 & 0xffffffff,0x4d2,poVar1,ppoVar3);
    local_c0 = local_c0 +
               (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar4];
    datatype::~datatype(&dt);
    datatype::~datatype(&senddt);
  }
  requests::wait(&reqs,__stat_loc);
  requests::~requests(&reqs);
  return;
}

Assistant:

void allgatherv_big(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    size_t offset = 0;
    for (int i = 0; i < comm.size(); ++i) {
        // send to this rank
        mxx::datatype senddt = mxx::get_datatype<T>().contiguous(size);
        MPI_Isend(const_cast<T*>(data), 1, senddt.type(), i, tag, comm, &reqs.add());
        // receive from this rank
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[i]);
        MPI_Irecv(const_cast<T*>(out)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
        offset += recv_sizes[i];
    }
    reqs.wait();
}